

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.h
# Opt level: O0

void __thiscall
kj::Locked<kj::Executor::Impl::State>::wait<kj::Executor::send(kj::_::XThreadEvent&,bool)const::__1>
          (Locked<kj::Executor::Impl::State> *this,
          NoInfer<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:1320:15)>
          *condition,State *timeout)

{
  Mutex *this_00;
  Type *condition_00;
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_> local_50;
  undefined1 local_40 [8];
  PredicateImpl impl;
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_> *timeout_local;
  Type *condition_local;
  Locked<kj::Executor::Impl::State> *this_local;
  
  impl.value = timeout;
  condition_00 = fwd<kj::Executor::send(kj::_::XThreadEvent&,bool)const::__1>(condition);
  Locked<kj::Executor::Impl::State>::wait<kj::Executor::send(kj::_::XThreadEvent&,bool)const::
  $_1>(kj::Executor::send(kj::_::XThreadEvent&,bool)const::$_1&&,kj::Maybe<kj::Quantity<long,kj::_::
  NanosecondLabel>>,kj::NoopSourceLocation)::PredicateImpl::PredicateImpl(kj::Executor::
  send(kj::_::XThreadEvent&,bool)::State_const__(local_40,condition_00,this->ptr);
  this_00 = this->mutex;
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::Maybe
            (&local_50,(Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_> *)timeout);
  kj::_::Mutex::wait(this_00,local_40);
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::~Maybe(&local_50);
  return;
}

Assistant:

void wait(Cond&& condition, Maybe<Duration> timeout = kj::none,
      LockSourceLocationArg location = {}) {
    // Unlocks the lock until `condition(state)` evaluates true (where `state` is type `const T&`
    // referencing the object protected by the lock).

    // We can't wait on a shared lock because the internal bookkeeping needed for a wait requires
    // the protection of an exclusive lock.
    static_assert(!isConst<T>(), "cannot wait() on shared lock");

    struct PredicateImpl final: public _::Mutex::Predicate {
      bool check() override {
        return condition(value);
      }

      Cond&& condition;
      const T& value;

      PredicateImpl(Cond&& condition, const T& value)
          : condition(kj::fwd<Cond>(condition)), value(value) {}
    };

    PredicateImpl impl(kj::fwd<Cond>(condition), *ptr);
    mutex->wait(impl, timeout, location);
  }